

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::EdgeChainSimplifier::SimplifyChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  VertexId VVar1;
  bool bVar2;
  S2Point *pSVar3;
  size_type sVar4;
  reference pvVar5;
  bool local_a2;
  bool local_a1;
  undefined1 auStack_90 [4];
  VertexId vprev;
  bool local_7d;
  VertexId local_7c;
  undefined1 local_78 [3];
  bool done;
  VertexId vstart;
  S2PolylineSimplifier simplifier;
  vector<int,_std::allocator<int>_> *chain;
  VertexId v1_local;
  VertexId v0_local;
  EdgeChainSimplifier *this_local;
  
  simplifier.window_.bounds_.c_[1] = (VType)&this->tmp_vertices_;
  chain._0_4_ = v1;
  chain._4_4_ = v0;
  _v1_local = this;
  S2PolylineSimplifier::S2PolylineSimplifier((S2PolylineSimplifier *)local_78);
  local_7c = chain._4_4_;
  local_7d = false;
  do {
    pSVar3 = Graph::vertex(this->g_,chain._4_4_);
    S2PolylineSimplifier::Init((S2PolylineSimplifier *)local_78,pSVar3);
    AvoidSites(this,chain._4_4_,chain._4_4_,(VertexId)chain,(S2PolylineSimplifier *)local_78);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1],
               (value_type_conflict1 *)((long)&chain + 4));
    do {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1],
                 (value_type_conflict1 *)&chain);
      _auStack_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (&this->is_interior_,(long)(VertexId)chain);
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_90);
      VVar1 = chain._4_4_;
      local_a1 = !bVar2 || (VertexId)chain == local_7c;
      local_7d = local_a1;
      if (!bVar2 || (VertexId)chain == local_7c) break;
      chain._4_4_ = (VertexId)chain;
      chain._0_4_ = FollowChain(this,VVar1,(VertexId)chain);
      bVar2 = TargetInputVertices(this,chain._4_4_,(S2PolylineSimplifier *)local_78);
      local_a2 = false;
      if (bVar2) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1],0)
        ;
        bVar2 = AvoidSites(this,*pvVar5,chain._4_4_,(VertexId)chain,(S2PolylineSimplifier *)local_78
                          );
        local_a2 = false;
        if (bVar2) {
          pSVar3 = Graph::vertex(this->g_,(VertexId)chain);
          local_a2 = S2PolylineSimplifier::Extend((S2PolylineSimplifier *)local_78,pSVar3);
        }
      }
    } while (local_a2 != false);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1]);
    if (sVar4 == 2) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1],0);
      VVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1],1);
      OutputAllEdges(this,VVar1,*pvVar5);
    }
    else {
      MergeChain(this,(vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1]);
    }
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)simplifier.window_.bounds_.c_[1]);
    if (((local_7d ^ 0xffU) & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void S2Builder::EdgeChainSimplifier::SimplifyChain(VertexId v0, VertexId v1) {
  // Avoid allocating "chain" each time by reusing it.
  vector<VertexId>& chain = tmp_vertices_;
  S2PolylineSimplifier simplifier;
  VertexId vstart = v0;
  bool done = false;
  do {
    // Simplify a subchain of edges starting (v0, v1).
    simplifier.Init(g_.vertex(v0));
    AvoidSites(v0, v0, v1, &simplifier);
    chain.push_back(v0);
    do {
      chain.push_back(v1);
      done = !is_interior_[v1] || v1 == vstart;
      if (done) break;

      // Attempt to extend the chain to the next vertex.
      VertexId vprev = v0;
      v0 = v1;
      v1 = FollowChain(vprev, v0);
    } while (TargetInputVertices(v0, &simplifier) &&
             AvoidSites(chain[0], v0, v1, &simplifier) &&
             simplifier.Extend(g_.vertex(v1)));

    if (chain.size() == 2) {
      OutputAllEdges(chain[0], chain[1]);  // Could not simplify.
    } else {
      MergeChain(chain);
    }
    // Note that any degenerate edges that were not merged into a chain are
    // output by EdgeChainSimplifier::Run().
    chain.clear();
  } while (!done);
}